

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ExportAggregateFunctionBindData::Copy(ExportAggregateFunctionBindData *this)

{
  _func_int **pp_Var1;
  pointer pBVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _func_int **local_18;
  
  pBVar2 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)(in_RSI + 8));
  (*(pBVar2->super_Expression).super_BaseExpression._vptr_BaseExpression[0x11])(&local_20,pBVar2);
  make_uniq<duckdb::ExportAggregateFunctionBindData,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)&local_18,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  pp_Var1 = local_18;
  local_18 = (_func_int **)0x0;
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ExportAggregateFunctionBindData::Copy() const {
	return make_uniq<ExportAggregateFunctionBindData>(aggregate->Copy());
}